

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::create_color_selector_codebook(dxt_hc *this)

{
  vector<unsigned_int> *this_00;
  vector<bool> *this_01;
  elemental_vector *this_02;
  int *piVar1;
  float *pfVar2;
  unsigned_long_long *puVar3;
  uint *puVar4;
  task_pool *this_03;
  uint64 uVar5;
  bool *pbVar6;
  uint *puVar7;
  undefined1 auVar8 [8];
  uint uVar9;
  uint s;
  uint min_new_capacity;
  int iVar10;
  vec<16U,_float> *pvVar11;
  executable_task *pObj;
  int iVar12;
  long lVar13;
  undefined1 uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  uint uVar19;
  uint64 uVar20;
  uint *puVar21;
  unsigned_long_long uVar22;
  ulong uVar23;
  uint64 uVar24;
  void *pvVar25;
  ulong uVar26;
  uint t;
  long lVar27;
  void *pvVar28;
  uint64 uVar29;
  uint8 p;
  uint64 uVar30;
  ulong uVar31;
  bool bVar32;
  vector<crnlib::vector<crnlib::color_selector_details>_> selector_details;
  vector<crnlib::SelectorNode> nodes;
  vector<unsigned_int> weights;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<unsigned_long_long> selectors;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  float v [4];
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  undefined1 local_178 [8];
  uint64 *puStack_170;
  elemental_vector local_168;
  vector<unsigned_int> local_158;
  vector<crnlib::vec<16U,_float>_> local_148;
  elemental_vector local_138;
  ulong local_120;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  local_118;
  vector<bool> *local_f8;
  vector<unsigned_int> *local_f0;
  float afStack_e8 [4];
  tree_clusterizer<crnlib::vec<16U,_float>_> local_d8;
  
  uVar15 = this->m_num_blocks >> (this->m_has_subblocks & 0x1fU);
  uVar17 = this->m_pTask_pool->m_num_threads;
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar15 != 0) {
    elemental_vector::increase_capacity(&local_138,uVar15,uVar15 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_138._8_8_ & 0xffffffff) * 8 + (long)local_138.m_p),0,
           (ulong)(uVar15 - local_138.m_size) << 3);
    local_138.m_size = uVar15;
  }
  min_new_capacity = uVar17 + 1;
  uVar15 = this->m_num_blocks;
  if (uVar15 != 0) {
    bVar32 = this->m_has_subblocks;
    puVar3 = this->m_block_selectors[0].m_p;
    uVar16 = 0;
    uVar26 = 0;
    do {
      if (bVar32 == false) {
        uVar22 = 0;
      }
      else {
        uVar22 = puVar3[(int)uVar26 + 1];
      }
      uVar23 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
      *(unsigned_long_long *)((long)local_138.m_p + uVar23 * 8) = uVar22 + puVar3[uVar26];
      uVar19 = (int)uVar26 + bVar32 + 1;
      uVar26 = (ulong)uVar19;
    } while (uVar19 < uVar15);
  }
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  local_120 = (ulong)uVar17;
  if (min_new_capacity != 0) {
    iVar12 = 1;
    pvVar28 = local_138.m_p;
    do {
      pvVar25 = (void *)(((ulong)(local_138.m_size * iVar12) / (ulong)min_new_capacity) * 8 +
                        (long)local_138.m_p);
      if (pvVar28 != pvVar25) {
        if (local_168.m_capacity <= local_168.m_size) {
          elemental_vector::increase_capacity
                    (&local_168,local_168.m_size + 1,true,0x10,
                     vector<crnlib::SelectorNode>::object_mover,false);
        }
        lVar13 = (local_168._8_8_ & 0xffffffff) * 0x10;
        *(void **)((long)local_168.m_p + lVar13) = pvVar28;
        *(void **)((long)local_168.m_p + lVar13 + 8) = pvVar25;
        local_168.m_size = local_168.m_size + 1;
      }
      iVar10 = (1 - uVar17) + iVar12;
      iVar12 = iVar12 + 1;
      pvVar28 = pvVar25;
    } while (iVar10 != 2);
  }
  if (local_168.m_size != 0) {
    lVar13 = 0;
    uVar30 = 0;
    do {
      task_pool::queue_task
                (this->m_pTask_pool,SelectorNode::sort_task,uVar30,
                 (void *)((long)local_168.m_p + lVar13));
      uVar30 = uVar30 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar30 < (local_168._8_8_ & 0xffffffff));
  }
  task_pool::join(this->m_pTask_pool);
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_168.m_size != 0) {
    lVar13 = 0;
    uVar26 = 0;
    do {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push(&local_118,(value_type *)((long)local_168.m_p + lVar13));
      uVar26 = uVar26 + 1;
      lVar13 = lVar13 + 0x10;
    } while (uVar26 < (local_168._8_8_ & 0xffffffff));
  }
  lVar13 = 0;
  do {
    afStack_e8[lVar13] = ((float)(int)lVar13 + 0.5) * 0.25;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_148.m_p = (vec<16U,_float> *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  local_158.m_p = (uint *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&local_148,local_138.m_size);
  vector<unsigned_int>::reserve(&local_158,local_138.m_size);
  if (local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar26 = 0;
    do {
      puStack_170 = (local_118.c.
                     super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pEnd;
      local_178 = (undefined1  [8])
                  ((local_118.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start)->p + 1);
      uVar23 = *(local_118.c.
                 super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                 _M_impl.super__Vector_impl_data._M_start)->p;
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::pop(&local_118);
      if (local_178 != (undefined1  [8])puStack_170) {
        std::
        priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
        ::push(&local_118,(value_type *)local_178);
      }
      uVar31 = uVar23 >> 0x20;
      uVar17 = (uint)uVar23;
      if (local_148.m_size == 0 || uVar31 != uVar26) {
        lVar13 = 0xf;
        uVar26 = uVar31;
        do {
          *(float *)((long)&local_d8.m_vectors + lVar13 * 4) = afStack_e8[(uint)uVar26 & 3];
          uVar26 = uVar26 >> 2;
          bVar32 = lVar13 != 0;
          lVar13 = lVar13 + -1;
        } while (bVar32);
        if (local_148.m_capacity <= local_148.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_148,local_148.m_size + 1,true,0x40,(object_mover)0x0
                     ,false);
        }
        uVar26 = local_148._8_8_ & 0xffffffff;
        pfVar2 = local_148.m_p[uVar26].m_s + 0xc;
        pfVar2[0] = (float)local_d8.m_vectorsInfo.m_size;
        pfVar2[1] = (float)local_d8.m_vectorsInfo.m_capacity;
        *(VectorInfo **)(pfVar2 + 2) = local_d8.m_vectorsInfoLeft.m_p;
        pfVar2 = local_148.m_p[uVar26].m_s + 8;
        pfVar2[0] = (float)local_d8.m_weightedDotProducts.m_size;
        pfVar2[1] = (float)local_d8.m_weightedDotProducts.m_capacity;
        *(VectorInfo **)(pfVar2 + 2) = local_d8.m_vectorsInfo.m_p;
        pfVar2 = local_148.m_p[uVar26].m_s + 4;
        pfVar2[0] = (float)local_d8.m_weightedVectors.m_size;
        pfVar2[1] = (float)local_d8.m_weightedVectors.m_capacity;
        *(double **)(pfVar2 + 2) = local_d8.m_weightedDotProducts.m_p;
        *(vec<16U,_float> **)local_148.m_p[uVar26].m_s = local_d8.m_vectors;
        *(vec<16U,_float> **)(local_148.m_p[uVar26].m_s + 2) = local_d8.m_weightedVectors.m_p;
        local_148.m_size = local_148.m_size + 1;
        if (local_158.m_capacity <= local_158.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_158,local_158.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_158.m_p[local_158._8_8_ & 0xffffffff] = uVar17;
        local_158.m_size = local_158.m_size + 1;
        uVar26 = uVar31;
      }
      else {
        uVar15 = local_158.m_size - 1;
        if (CARRY4(local_158.m_p[uVar15],uVar17)) {
          local_158.m_p[uVar15] = 0xffffffff;
        }
        else {
          local_158.m_p[uVar15] = local_158.m_p[uVar15] + uVar17;
        }
      }
    } while (local_118.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_finish !=
             local_118.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_start);
  }
  local_d8.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  local_d8.m_node_index_map.m_values.m_size = 0;
  local_d8.m_node_index_map.m_values.m_capacity = 0;
  local_d8.m_vectorComparison.m_p = (bool *)0x0;
  local_d8.m_vectorComparison.m_size = 0;
  local_d8.m_vectorComparison.m_capacity = 0;
  local_d8.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoRight.m_size = 0;
  local_d8.m_vectorsInfoRight.m_capacity = 0;
  local_d8.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoLeft.m_size = 0;
  local_d8.m_vectorsInfoLeft.m_capacity = 0;
  local_d8.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfo.m_size = 0;
  local_d8.m_vectorsInfo.m_capacity = 0;
  local_d8.m_weightedDotProducts.m_p = (double *)0x0;
  local_d8.m_weightedDotProducts.m_size = 0;
  local_d8.m_weightedDotProducts.m_capacity = 0;
  local_d8.m_weightedVectors.m_p = (vec<16U,_float> *)0x0;
  local_d8.m_weightedVectors.m_size = 0;
  local_d8.m_weightedVectors.m_capacity = 0;
  local_d8.m_node_index_map.m_hash_shift = 0x20;
  local_d8.m_node_index_map.m_num_valid = 0;
  local_d8.m_node_index_map.m_grow_threshold = 0;
  local_d8.m_nodes.m_p = (vq_node *)0x0;
  local_d8.m_nodes.m_size = 0;
  local_d8.m_nodes.m_capacity = 0;
  local_d8.m_codebook.m_p = (vec<16U,_float> *)0x0;
  local_d8.m_codebook.m_size = 0;
  local_d8.m_codebook.m_capacity = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            (&local_d8,local_148.m_p,local_158.m_p,local_148.m_size,
             (this->m_params).m_color_selector_codebook_size,false,this->m_pTask_pool);
  this_00 = &this->m_color_selectors;
  uVar9 = local_d8.m_codebook.m_size;
  uVar17 = (this->m_color_selectors).m_size;
  if (uVar17 != local_d8.m_codebook.m_size) {
    if (uVar17 <= local_d8.m_codebook.m_size) {
      if ((this->m_color_selectors).m_capacity < local_d8.m_codebook.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,local_d8.m_codebook.m_size,
                   uVar17 + 1 == local_d8.m_codebook.m_size,4,(object_mover)0x0,false);
      }
      uVar17 = (this->m_color_selectors).m_size;
      memset((this->m_color_selectors).m_p + uVar17,0,(ulong)(uVar9 - uVar17) << 2);
    }
    (this->m_color_selectors).m_size = uVar9;
  }
  this_01 = &this->m_color_selectors_used;
  uVar9 = local_d8.m_codebook.m_size;
  uVar17 = (this->m_color_selectors_used).m_size;
  if (uVar17 != local_d8.m_codebook.m_size) {
    if (uVar17 <= local_d8.m_codebook.m_size) {
      if ((this->m_color_selectors_used).m_capacity < local_d8.m_codebook.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,local_d8.m_codebook.m_size,
                   uVar17 + 1 == local_d8.m_codebook.m_size,1,(object_mover)0x0,false);
      }
      uVar17 = (this->m_color_selectors_used).m_size;
      memset((this->m_color_selectors_used).m_p + uVar17,0,(ulong)(uVar9 - uVar17));
    }
    (this->m_color_selectors_used).m_size = uVar9;
  }
  if (local_d8.m_codebook.m_size != 0) {
    puVar4 = this_00->m_p;
    uVar26 = 0;
    pvVar11 = local_d8.m_codebook.m_p;
    do {
      puVar4[uVar26] = 0;
      lVar13 = 0;
      uVar17 = 0;
      do {
        uVar17 = uVar17 | (int)(long)(*(float *)((long)pvVar11->m_s + lVar13 * 2) * 4.0) <<
                          ((byte)lVar13 & 0x1f);
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0x20);
      puVar4[uVar26] = uVar17;
      uVar26 = uVar26 + 1;
      pvVar11 = pvVar11 + 1;
    } while (uVar26 < (local_d8.m_codebook._8_8_ & 0xffffffff));
  }
  local_178 = (undefined1  [8])0x0;
  puStack_170 = (uint64 *)0x0;
  local_f8 = this_01;
  local_f0 = this_00;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)local_178,min_new_capacity,(int)local_120 == 0,0x10,
               (object_mover)0x0,false);
    if (min_new_capacity != (uint)puStack_170) {
      memset((uint64 *)((long)local_178 + ((ulong)puStack_170 & 0xffffffff) * 2 * 8),0,
             (ulong)(min_new_capacity - (uint)puStack_170) << 4);
    }
    puStack_170 = (uint64 *)CONCAT44(puStack_170._4_4_,min_new_capacity);
    lVar13 = 0;
    uVar30 = 0;
    do {
      this_02 = (elemental_vector *)((long)local_178 + lVar13);
      uVar17 = (this->m_color_selectors).m_size;
      uVar15 = *(uint *)((long)local_178 + lVar13 + 8);
      if (uVar15 != uVar17) {
        if (uVar15 <= uVar17) {
          if (*(uint *)((long)local_178 + lVar13 + 0xc) < uVar17) {
            elemental_vector::increase_capacity
                      (this_02,uVar17,uVar15 + 1 == uVar17,0x104,
                       vector<crnlib::color_selector_details>::object_mover,false);
          }
          uVar15 = this_02->m_size;
          if (uVar17 != uVar15) {
            memset((void *)((ulong)uVar15 * 0x104 + (long)this_02->m_p),0,
                   (((ulong)(uVar17 - uVar15) * 0x104 - 0x104) / 0x104) * 0x104 + 0x104);
          }
        }
        this_02->m_size = uVar17;
      }
      auVar8 = local_178;
      this_03 = this->m_pTask_pool;
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce9c0;
      pObj[1]._vptr_executable_task = (_func_int **)this;
      pObj[2]._vptr_executable_task = (_func_int **)create_color_selector_codebook_task;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      task_pool::queue_task(this_03,pObj,uVar30,(void *)((long)auVar8 + lVar13));
      uVar30 = uVar30 + 1;
      lVar13 = lVar13 + 0x10;
    } while (min_new_capacity != uVar30);
  }
  task_pool::join(this->m_pTask_pool);
  auVar8 = local_178;
  if (1 < min_new_capacity) {
    uVar26 = 1;
    do {
      if ((this->m_color_selectors).m_size != 0) {
        uVar30 = *(uint64 *)((long)local_178 + uVar26 * 2 * 8);
        uVar5 = *(uint64 *)local_178;
        uVar23 = 0;
        uVar20 = uVar5;
        do {
          lVar13 = 0;
          uVar24 = uVar20;
          uVar29 = uVar30;
          do {
            lVar27 = 0;
            do {
              piVar1 = (int *)(uVar24 + lVar27 * 4);
              *piVar1 = *piVar1 + *(int *)(uVar29 + lVar27 * 4);
              lVar27 = lVar27 + 1;
            } while (lVar27 != 4);
            lVar13 = lVar13 + 1;
            uVar29 = uVar29 + 0x10;
            uVar24 = uVar24 + 0x10;
          } while (lVar13 != 0x10);
          lVar13 = uVar23 * 0x104;
          uVar14 = 1;
          if (*(char *)(uVar5 + 0x100 + lVar13) == '\0') {
            uVar14 = *(undefined1 *)(*(uint64 *)((long)local_178 + uVar26 * 2 * 8) + 0x100 + lVar13)
            ;
          }
          *(undefined1 *)(lVar13 + uVar5 + 0x100) = uVar14;
          uVar23 = uVar23 + 1;
          uVar30 = uVar30 + 0x104;
          uVar20 = uVar20 + 0x104;
        } while (uVar23 < (this->m_color_selectors).m_size);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != min_new_capacity);
  }
  if ((this->m_color_selectors).m_size != 0) {
    puVar4 = *(uint **)local_178;
    pbVar6 = local_f8->m_p;
    puVar7 = local_f0->m_p;
    uVar26 = 0;
    puVar18 = puVar4;
    do {
      pbVar6[uVar26] = SUB41(puVar4[uVar26 * 0x41 + 0x40],0);
      puVar7[uVar26] = 0;
      lVar13 = 0;
      uVar17 = 0;
      puVar21 = puVar18;
      do {
        if (puVar21[(ulong)(puVar21[2] < puVar21[1]) + 1] <
            *(uint *)((long)puVar21 + (ulong)((uint)(puVar21[3] < *puVar21) * 0xc))) {
          uVar15 = (uint)(byte)((puVar21[2] < puVar21[1]) + 1);
        }
        else {
          uVar15 = (uint)(puVar21[3] < *puVar21) * 3;
        }
        uVar17 = uVar17 | uVar15 << ((byte)lVar13 & 0x1f);
        puVar7[uVar26] = uVar17;
        puVar21 = puVar21 + 4;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0x20);
      uVar26 = uVar26 + 1;
      puVar18 = puVar18 + 0x41;
    } while (uVar26 < (this->m_color_selectors).m_size);
  }
  if (local_178 != (undefined1  [8])0x0) {
    uVar26 = (ulong)puStack_170 & 0xffffffff;
    if (uVar26 != 0) {
      lVar13 = 0;
      do {
        if (*(void **)((long)auVar8 + lVar13) != (void *)0x0) {
          crnlib_free(*(void **)((long)auVar8 + lVar13));
        }
        lVar13 = lVar13 + 0x10;
      } while (uVar26 << 4 != lVar13);
    }
    crnlib_free((void *)local_178);
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer(&local_d8);
  if (local_158.m_p != (uint *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if (local_148.m_p != (vec<16U,_float> *)0x0) {
    crnlib_free(local_148.m_p);
  }
  if (local_118.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<uint64> selectors(m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks);
        for (uint i = 0, b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
        {
            selectors[i++] = m_block_selectors[cColor][b] + (m_has_subblocks ? m_block_selectors[cColor][b + 1] : 0);
        }

        crnlib::vector<SelectorNode> nodes;
        SelectorNode node(0, selectors.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<SelectorNode> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        float v[4];
        for (uint s = 0; s < 4; s++)
        {
            v[s] = (s + 0.5f) * 0.25f;
        }

        crnlib::vector<vec16F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(selectors.size());
        weights.reserve(selectors.size());
        for (uint64 prev_selector = 0; queue.size();)
        {
            SelectorNode node = queue.top();
            uint64 selector = *node.p++;
            queue.pop();
            if (node.p != node.pEnd)
            {
                queue.push(node);
            }
            uint weight = (uint)selector;
            selector >>= 32;
            if (!vectors.size() || selector != prev_selector)
            {
                prev_selector = selector;
                vec16F vector;
                for (uint p = 0; p < 16; p++, selector >>= 2)
                {
                    vector[15 - p] = v[selector & 3];
                }
                vectors.push_back(vector);
                weights.push_back(weight);
            }
            else if (weights.back() > UINT_MAX - weight)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += weight;
            }
        }

        tree_clusterizer<vec16F> selector_vq;
        selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_color_selector_codebook_size, false, m_pTask_pool);
        m_color_selectors.resize(selector_vq.get_codebook_size());
        m_color_selectors_used.resize(selector_vq.get_codebook_size());
        for (uint i = 0; i < selector_vq.get_codebook_size(); i++)
        {
            const vec16F& v = selector_vq.get_codebook_entry(i);
            m_color_selectors[i] = 0;
            for (uint sh = 0, j = 0; j < 16; j++, sh += 2)
            {
                m_color_selectors[i] |= (uint)(v[j] * 4.0f) << sh;
            }
        }

        crnlib::vector<crnlib::vector<color_selector_details>> selector_details(num_tasks);
        for (uint t = 0; t < num_tasks; t++)
        {
            selector_details[t].resize(m_color_selectors.size());
            m_pTask_pool->queue_object_task(this, &dxt_hc::create_color_selector_codebook_task, t, &selector_details[t]);
        }
        m_pTask_pool->join();

        for (uint t = 1; t < num_tasks; t++)
        {
            for (uint i = 0; i < m_color_selectors.size(); i++)
            {
                for (uint8 p = 0; p < 16; p++)
                {
                    for (uint8 s = 0; s < 4; s++)
                    {
                        selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
                    }
                }
                selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
            }
        }

        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            m_color_selectors_used[i] = selector_details[0][i].used;
            uint(&errors)[16][4] = selector_details[0][i].error;
            m_color_selectors[i] = 0;
            for (uint sh = 0, p = 0; p < 16; p++, sh += 2)
            {
                uint* e = errors[p];
                uint8 s03 = e[3] < e[0] ? 3 : 0;
                uint8 s12 = e[2] < e[1] ? 2 : 1;
                m_color_selectors[i] |= (e[s12] < e[s03] ? s12 : s03) << sh;
            }
        }
    }